

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolverAPI.c
# Opt level: O0

void xSAT_SolverDestroy(xSAT_Solver_t *s)

{
  xSAT_Solver_t *s_local;
  
  xSAT_MemFree(s->pMemory);
  Vec_IntFree(s->vClauses);
  Vec_IntFree(s->vLearnts);
  xSAT_VecWatchListFree(s->vWatches);
  xSAT_VecWatchListFree(s->vBinWatches);
  xSAT_HeapFree(s->hOrder);
  Vec_IntFree(s->vTrailLim);
  Vec_IntFree(s->vTrail);
  Vec_IntFree(s->vTagged);
  Vec_IntFree(s->vStack);
  Vec_StrFree(s->vSeen);
  Vec_IntFree(s->vLearntClause);
  Vec_IntFree(s->vLastDLevel);
  Vec_IntFree(s->vActivity);
  Vec_StrFree(s->vPolarity);
  Vec_StrFree(s->vTags);
  Vec_StrFree(s->vAssigns);
  Vec_IntFree(s->vLevels);
  Vec_IntFree(s->vReasons);
  Vec_IntFree(s->vStamp);
  xSAT_BQueueFree(s->bqLBD);
  xSAT_BQueueFree(s->bqTrail);
  if (s != (xSAT_Solver_t *)0x0) {
    free(s);
  }
  return;
}

Assistant:

void xSAT_SolverDestroy( xSAT_Solver_t * s )
{
    xSAT_MemFree( s->pMemory );
    Vec_IntFree( s->vClauses );
    Vec_IntFree( s->vLearnts );
    xSAT_VecWatchListFree( s->vWatches );
    xSAT_VecWatchListFree( s->vBinWatches );

    xSAT_HeapFree(s->hOrder);
    Vec_IntFree( s->vTrailLim );
    Vec_IntFree( s->vTrail );
    Vec_IntFree( s->vTagged );
    Vec_IntFree( s->vStack );

    Vec_StrFree( s->vSeen );
    Vec_IntFree( s->vLearntClause );
    Vec_IntFree( s->vLastDLevel );

    Vec_IntFree( s->vActivity );
    Vec_StrFree( s->vPolarity );
    Vec_StrFree( s->vTags );
    Vec_StrFree( s->vAssigns );
    Vec_IntFree( s->vLevels );
    Vec_IntFree( s->vReasons );
    Vec_IntFree( s->vStamp );

    xSAT_BQueueFree(s->bqLBD);
    xSAT_BQueueFree(s->bqTrail);

    ABC_FREE(s);
}